

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_to_signed62(secp256k1_modinv64_signed62 *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = a->n[1];
  uVar2 = a->n[2];
  uVar3 = a->n[3];
  uVar4 = a->n[4];
  r->v[0] = (uVar1 << 0x34 | a->n[0]) & 0x3fffffffffffffff;
  r->v[1] = (ulong)((uint)uVar2 & 0xfffff) << 0x2a | uVar1 >> 10;
  r->v[2] = (ulong)((uint)uVar3 & 0x3fffffff) << 0x20 | uVar2 >> 0x14;
  r->v[3] = (uVar4 & 0xffffffffff) << 0x16 | uVar3 >> 0x1e;
  r->v[4] = uVar4 >> 0x28;
  return;
}

Assistant:

static void secp256k1_fe_to_signed62(secp256k1_modinv64_signed62 *r, const secp256k1_fe *a) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const uint64_t a0 = a->n[0], a1 = a->n[1], a2 = a->n[2], a3 = a->n[3], a4 = a->n[4];

    r->v[0] = (a0       | a1 << 52) & M62;
    r->v[1] = (a1 >> 10 | a2 << 42) & M62;
    r->v[2] = (a2 >> 20 | a3 << 32) & M62;
    r->v[3] = (a3 >> 30 | a4 << 22) & M62;
    r->v[4] =  a4 >> 40;
}